

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSimdShuffleOp(TypeChecker *this,Opcode opcode,v128 lane_idx)

{
  Result RVar1;
  Result local_40;
  int local_3c;
  undefined8 uStack_38;
  int i;
  uint8_t simd_data [16];
  TypeChecker *this_local;
  v128 lane_idx_local;
  Opcode opcode_local;
  Result result;
  
  lane_idx_local.v._0_8_ = lane_idx.v._8_8_;
  simd_data._8_8_ = this;
  lane_idx_local.v._8_4_ = opcode.enum_;
  Result::Result((Result *)(lane_idx_local.v + 0xc),Ok);
  uStack_38 = lane_idx.v._0_8_;
  simd_data[0] = lane_idx_local.v[0];
  simd_data[1] = lane_idx_local.v[1];
  simd_data[2] = lane_idx_local.v[2];
  simd_data[3] = lane_idx_local.v[3];
  simd_data[4] = lane_idx_local.v[4];
  simd_data[5] = lane_idx_local.v[5];
  simd_data[6] = lane_idx_local.v[6];
  simd_data[7] = lane_idx_local.v[7];
  for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
    if (0x1f < (&lane_idx_local)[-2].v[local_3c]) {
      PrintError(this,"lane index must be less than 32 (got %d)",
                 (ulong)(&lane_idx_local)[-2].v[local_3c]);
      Result::Result(&local_40,Error);
      lane_idx_local.v[0xc] = (undefined1)local_40.enum_;
      lane_idx_local.v[0xd] = local_40.enum_._1_1_;
      lane_idx_local.v[0xe] = local_40.enum_._2_1_;
      lane_idx_local.v[0xf] = local_40.enum_._3_1_;
    }
  }
  RVar1 = CheckOpcode2(this,(Opcode)lane_idx_local.v._8_4_);
  Result::operator|=((Result *)(lane_idx_local.v + 0xc),RVar1);
  RVar1.enum_._0_1_ = lane_idx_local.v[0xc];
  RVar1.enum_._1_1_ = lane_idx_local.v[0xd];
  RVar1.enum_._2_1_ = lane_idx_local.v[0xe];
  RVar1.enum_._3_1_ = lane_idx_local.v[0xf];
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnSimdShuffleOp(Opcode opcode, v128 lane_idx) {
  Result result = Result::Ok;
  uint8_t simd_data[16];
  memcpy(simd_data, &lane_idx, 16);
  for (int i = 0; i < 16; i++) {
    if (simd_data[i] >= 32) {
      PrintError("lane index must be less than 32 (got %d)", simd_data[i]);
      result = Result::Error;
    }
  }

  result |= CheckOpcode2(opcode);
  return result;
}